

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3ArrayAllocate(sqlite3 *db,void *pArray,int szEntry,int *pnEntry,int *pIdx)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong __n;
  
  iVar1 = *pnEntry;
  uVar4 = (ulong)iVar1;
  *pIdx = iVar1;
  __n = (ulong)(uint)szEntry;
  pvVar2 = pArray;
  if ((uVar4 & uVar4 - 1) == 0) {
    lVar3 = 1;
    if (iVar1 != 0) {
      lVar3 = uVar4 * 2;
    }
    pvVar2 = sqlite3DbRealloc(db,pArray,__n * lVar3);
    if (pvVar2 == (void *)0x0) {
      *pIdx = -1;
      return pArray;
    }
  }
  memset((void *)(uVar4 * __n + (long)pvVar2),0,__n);
  *pnEntry = *pnEntry + 1;
  return pvVar2;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ArrayAllocate(
  sqlite3 *db,      /* Connection to notify of malloc failures */
  void *pArray,     /* Array of objects.  Might be reallocated */
  int szEntry,      /* Size of each object in the array */
  int *pnEntry,     /* Number of objects currently in use */
  int *pIdx         /* Write the index of a new slot here */
){
  char *z;
  sqlite3_int64 n = *pIdx = *pnEntry;
  if( (n & (n-1))==0 ){
    sqlite3_int64 sz = (n==0) ? 1 : 2*n;
    void *pNew = sqlite3DbRealloc(db, pArray, sz*szEntry);
    if( pNew==0 ){
      *pIdx = -1;
      return pArray;
    }
    pArray = pNew;
  }
  z = (char*)pArray;
  memset(&z[n * szEntry], 0, szEntry);
  ++*pnEntry;
  return pArray;
}